

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O0

void ppc_hash32_set_r(PowerPCCPU_conflict3 *cpu,hwaddr pte_offset,uint32_t pte1)

{
  hwaddr hVar1;
  hwaddr offset;
  target_ulong base;
  uint32_t pte1_local;
  hwaddr pte_offset_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  hVar1 = ppc_hash32_hpt_base(cpu);
  stb_phys_ppc64((cpu->env).uc,(cpu->parent_obj).as,hVar1 + pte_offset + 6,pte1 >> 8 & 0xff | 1);
  return;
}

Assistant:

static void ppc_hash32_set_r(PowerPCCPU *cpu, hwaddr pte_offset, uint32_t pte1)
{
    target_ulong base = ppc_hash32_hpt_base(cpu);
    hwaddr offset = pte_offset + 6;

    /* The HW performs a non-atomic byte update */
#ifdef UNICORN_ARCH_POSTFIX
    glue(stb_phys, UNICORN_ARCH_POSTFIX)(cpu->env.uc, CPU(cpu)->as, base + offset, ((pte1 >> 8) & 0xff) | 0x01);
#else
    stb_phys(cpu->env.uc, CPU(cpu)->as, base + offset, ((pte1 >> 8) & 0xff) | 0x01);
#endif
}